

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

upb_test_FakeMessageSet_Item **
upb_test_FakeMessageSet_item(upb_test_FakeMessageSet *msg,size_t *size)

{
  upb_Array *array;
  upb_Array *arr;
  upb_MiniTableField field;
  size_t *size_local;
  upb_test_FakeMessageSet *msg_local;
  
  stack0xffffffffffffffd4 = 0x800000001;
  field.number_dont_copy_me__upb_internal_use_only = 0xc10a0000;
  field._4_8_ = size;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&upb_0test__FakeMessageSet__Item_msg_init);
  array = upb_Message_GetArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     (upb_MiniTableField *)((long)&arr + 4));
  if (array == (upb_Array *)0x0) {
    if (field._4_8_ != 0) {
      *(undefined8 *)field._4_8_ = 0;
    }
    msg_local = (upb_test_FakeMessageSet *)0x0;
  }
  else {
    if (field._4_8_ != 0) {
      *(size_t *)field._4_8_ = array->size_dont_copy_me__upb_internal_use_only;
    }
    msg_local = (upb_test_FakeMessageSet *)upb_Array_DataPtr(array);
  }
  return (upb_test_FakeMessageSet_Item **)msg_local;
}

Assistant:

UPB_INLINE const upb_test_FakeMessageSet_Item* const* upb_test_FakeMessageSet_item(const upb_test_FakeMessageSet* msg, size_t* size) {
  const upb_MiniTableField field = {1, 8, 0, 0, 10, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__FakeMessageSet__Item_msg_init);
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (const upb_test_FakeMessageSet_Item* const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}